

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O0

void init_grid(void)

{
  double dVar1;
  double d;
  double dy;
  double dx;
  int y;
  int x;
  
  for (dx._0_4_ = 0; dx._0_4_ < 0x32; dx._0_4_ = dx._0_4_ + 1) {
    for (dx._4_4_ = 0; dx._4_4_ < 0x32; dx._4_4_ = dx._4_4_ + 1) {
      dVar1 = sqrt((double)(dx._4_4_ + -0x19) * (double)(dx._4_4_ + -0x19) +
                   (double)(dx._0_4_ + -0x19) * (double)(dx._0_4_ + -0x19));
      if (2.5 <= dVar1) {
        p[dx._4_4_][dx._0_4_] = 0.0;
      }
      else {
        dVar1 = cos(dVar1 * 10.0 * 0.015707963267948967);
        p[dx._4_4_][dx._0_4_] = -dVar1 * 100.0;
      }
      vx[dx._4_4_][dx._0_4_] = 0.0;
      vy[dx._4_4_][dx._0_4_] = 0.0;
    }
  }
  return;
}

Assistant:

void init_grid(void)
{
    int x, y;
    double dx, dy, d;

    for (y = 0; y < GRIDH;  y++)
    {
        for (x = 0; x < GRIDW;  x++)
        {
            dx = (double) (x - GRIDW / 2);
            dy = (double) (y - GRIDH / 2);
            d = sqrt(dx * dx + dy * dy);
            if (d < 0.1 * (double) (GRIDW / 2))
            {
                d = d * 10.0;
                p[x][y] = -cos(d * (M_PI / (double)(GRIDW * 4))) * 100.0;
            }
            else
                p[x][y] = 0.0;

            vx[x][y] = 0.0;
            vy[x][y] = 0.0;
        }
    }
}